

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O2

void __thiscall
helics::Input::registerNotificationCallback
          (Input *this,function<void_(TimeRepresentation<count_time<9,_long>_>)> *callback)

{
  ValueFederate *this_00;
  _Invoker_type p_Var1;
  _Manager_type p_Var2;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  Input *local_50;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type p_Stack_30;
  
  this_00 = this->fed;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_38 = (_Manager_type)0x0;
  p_Var1 = callback->_M_invoker;
  p_Var2 = (callback->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_48._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(callback->super__Function_base)._M_functor;
    local_48._8_8_ = *(undefined8 *)((long)&(callback->super__Function_base)._M_functor + 8);
    (callback->super__Function_base)._M_manager = (_Manager_type)0x0;
    callback->_M_invoker = (_Invoker_type)0x0;
    local_38 = p_Var2;
  }
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_50 = this;
  p_Stack_30 = p_Var1;
  local_78._M_unused._M_object = operator_new(0x28);
  *(Input **)local_78._M_unused._0_8_ = this;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x18) = 0;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x10) = 0;
  *(_Invoker_type *)((long)local_78._M_unused._0_8_ + 0x20) = p_Var1;
  if (p_Var2 != (_Manager_type)0x0) {
    *(void **)((long)local_78._M_unused._0_8_ + 8) = local_48._M_unused._M_object;
    *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x10) = local_48._8_8_;
    *(_Manager_type *)((long)local_78._M_unused._0_8_ + 0x18) = p_Var2;
    local_38 = (_Manager_type)0x0;
    p_Stack_30 = (_Invoker_type)0x0;
  }
  pcStack_60 = std::
               _Function_handler<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Inputs.cpp:627:39)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Inputs.cpp:627:39)>
             ::_M_manager;
  helics::ValueFederate::setInputNotificationCallback
            (this_00,this,
             (function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)> *)&local_78
            );
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  return;
}

Assistant:

void Input::registerNotificationCallback(std::function<void(Time)> callback)
{
    fed->setInputNotificationCallback(*this,
                                      [this, callback = std::move(callback)](const Input& /*inp*/,
                                                                             Time time) {
                                          if (isUpdated()) {
                                              callback(time);
                                          }
                                      });
}